

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_font_glyph * nk_font_find_glyph(nk_font *font,nk_rune unicode)

{
  uint uVar1;
  uint uVar2;
  nk_font_glyph *pnVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  nk_font_config *pnVar7;
  
  if (font == (nk_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x32b9,
                  "const struct nk_font_glyph *nk_font_find_glyph(struct nk_font *, nk_rune)");
  }
  if (font->glyphs != (nk_font_glyph *)0x0) {
    if ((font->info).ranges == (nk_rune *)0x0) {
      __assert_fail("font->info.ranges",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x32bb,
                    "const struct nk_font_glyph *nk_font_find_glyph(struct nk_font *, nk_rune)");
    }
    pnVar3 = font->fallback;
    pnVar7 = font->config;
    iVar6 = 0;
    do {
      uVar4 = nk_range_count(pnVar7->range);
      if (0 < (int)uVar4) {
        uVar5 = 0;
        do {
          uVar1 = pnVar7->range[uVar5 * 2];
          uVar2 = pnVar7->range[uVar5 * 2 + 1];
          if (unicode <= uVar2 && uVar1 <= unicode) {
            return font->glyphs + ((unicode + iVar6) - uVar1);
          }
          iVar6 = (iVar6 - uVar1) + uVar2 + 1;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      pnVar7 = pnVar7->n;
    } while (pnVar7 != font->config);
    return pnVar3;
  }
  __assert_fail("font->glyphs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x32ba,"const struct nk_font_glyph *nk_font_find_glyph(struct nk_font *, nk_rune)")
  ;
}

Assistant:

NK_API const struct nk_font_glyph*
nk_font_find_glyph(struct nk_font *font, nk_rune unicode)
{
    int i = 0;
    int count;
    int total_glyphs = 0;
    const struct nk_font_glyph *glyph = 0;
    const struct nk_font_config *iter = 0;

    NK_ASSERT(font);
    NK_ASSERT(font->glyphs);
    NK_ASSERT(font->info.ranges);
    if (!font || !font->glyphs) return 0;

    glyph = font->fallback;
    iter = font->config;
    do {count = nk_range_count(iter->range);
        for (i = 0; i < count; ++i) {
            nk_rune f = iter->range[(i*2)+0];
            nk_rune t = iter->range[(i*2)+1];
            int diff = (int)((t - f) + 1);
            if (unicode >= f && unicode <= t)
                return &font->glyphs[((nk_rune)total_glyphs + (unicode - f))];
            total_glyphs += diff;
        }
    } while ((iter = iter->n) != font->config);
    return glyph;
}